

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsPublicationPublishComplex(HelicsPublication pub,double real,double imag,HelicsError *err)

{
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  PublicationObject *pubObj;
  Publication *in_stack_00000060;
  undefined1 in_stack_00000068 [16];
  HelicsError *in_stack_ffffffffffffffb0;
  HelicsPublication in_stack_ffffffffffffffb8;
  complex<double> local_38;
  PublicationObject *local_28;
  double local_18;
  double local_10;
  
  local_18 = in_XMM1_Qa;
  local_10 = in_XMM0_Qa;
  local_28 = anon_unknown.dwarf_5d1c2::verifyPublication
                       (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (local_28 != (PublicationObject *)0x0) {
    std::complex<double>::complex(&local_38,local_10,local_18);
    helics::Publication::publish(in_stack_00000060,(complex<double>)in_stack_00000068);
  }
  return;
}

Assistant:

void helicsPublicationPublishComplex(HelicsPublication pub, double real, double imag, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        pubObj->pubPtr->publish(std::complex<double>(real, imag));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}